

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall ImgfsFile::freechunk(ImgfsFile *this,uint64_t ofs,uint size)

{
  element_type *peVar1;
  allocator_type local_32;
  value_type_conflict2 local_31;
  ByteVector data;
  
  markchunk(this,ofs,size,FREECHUNK);
  peVar1 = (this->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_ReadWriter[4])(peVar1,ofs);
  local_31 = 0xff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data,(ulong)size,&local_31,&local_32);
  peVar1 = (this->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_ReadWriter[3])
            (peVar1,data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
             (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void freechunk(uint64_t ofs, unsigned size)
    {
        markchunk(ofs, size, FREECHUNK);
        _rd->setpos(ofs);
        ByteVector data(size, 0xff);
        _rd->write(&data[0], data.size());
        //printf("freed chunk @ %08llx, size=%08x\n", ofs, size);
    }